

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-sdg-dump.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> uVar1;
  long lVar2;
  raw_ostream *prVar3;
  int iVar4;
  StringRef SVar5;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  SDGDumper dumper;
  LLVMAnalysisOptions local_748;
  DGLLVMPointerAnalysis PTA;
  SlicerOptions options;
  LLVMControlDependenceAnalysisOptions local_428;
  LLVMDataDependenceAnalysis DDA;
  LLVMPointerAnalysisOptions local_308;
  LLVMControlDependenceAnalysis CDA;
  LLVMDataDependenceAnalysisOptions local_220;
  SystemDependenceGraph sdg;
  
  setupStackTraceOnError(argc,argv);
  iVar4 = 1;
  parseSlicerOptions((int)&options,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  llvm::LLVMContext::LLVMContext(&context);
  parseModule((char *)&M,(LLVMContext *)"llvm-sdg-dump",(SlicerOptions *)&context);
  if ((__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)
      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) {
    SVar5.Length = (size_t)options.dgOptions.entryFunction._M_dataplus._M_p;
    SVar5.Data = (char *)M._M_t.
                         super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                         super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl;
    lVar2 = llvm::Module::getFunction(SVar5);
    uVar1 = M;
    if (lVar2 == 0) {
      prVar3 = (raw_ostream *)llvm::errs();
      prVar3 = llvm::raw_ostream::operator<<(prVar3,"The entry function not found: ");
      prVar3 = llvm::raw_ostream::operator<<(prVar3,&options.dgOptions.entryFunction);
      llvm::raw_ostream::operator<<(prVar3,"\n");
    }
    else {
      dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
                (&local_308,(LLVMPointerAnalysisOptions *)&options);
      dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
                (&PTA,(Module *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&local_308);
      dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions(&local_308);
      dg::DGLLVMPointerAnalysis::run(&PTA);
      uVar1 = M;
      dg::LLVMDataDependenceAnalysisOptions::LLVMDataDependenceAnalysisOptions
                (&local_220,&options.dgOptions.DDAOptions);
      dg::dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
                (&DDA,(Module *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,
                 &PTA.super_LLVMPointerAnalysis,&local_220);
      dg::LLVMDataDependenceAnalysisOptions::~LLVMDataDependenceAnalysisOptions(&local_220);
      dg::dda::LLVMDataDependenceAnalysis::run(&DDA);
      uVar1 = M;
      dg::LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions
                (&local_428,&options.dgOptions.CDAOptions);
      iVar4 = 0;
      dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                (&CDA,(Module *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&local_428,
                 (LLVMPointerAnalysis *)0x0);
      dg::LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions(&local_428);
      local_748.entryFunction._M_dataplus._M_p = (pointer)0x0;
      local_748.entryFunction._M_string_length = 0;
      local_748.entryFunction.field_2._M_allocated_capacity = 0;
      local_748.entryFunction.field_2._8_8_ = (_Base_ptr)0x0;
      dg::LLVMAnalysisOptions::LLVMAnalysisOptions(&local_748);
      dg::llvmdg::SystemDependenceGraph::SystemDependenceGraph
                (&sdg,(Module *)
                      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,
                 &PTA.super_LLVMPointerAnalysis,&DDA,&CDA,(SystemDependenceGraphOptions *)&local_748
                );
      std::__cxx11::string::_M_dispose();
      dumper.bb_only = (bool)dump_bb_only[0x80];
      dumper.options = &options;
      dumper.dg = &sdg;
      SDGDumper::dumpToDot(&dumper,(char *)0x0);
      dg::llvmdg::SystemDependenceGraph::~SystemDependenceGraph(&sdg);
      dg::LLVMControlDependenceAnalysis::~LLVMControlDependenceAnalysis(&CDA);
      dg::dda::LLVMDataDependenceAnalysis::~LLVMDataDependenceAnalysis(&DDA);
      dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis(&PTA);
    }
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&M);
  llvm::LLVMContext::~LLVMContext(&context);
  SlicerOptions::~SlicerOptions(&options);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-sdg-dump", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    DGLLVMPointerAnalysis PTA(M.get(), options.dgOptions.PTAOptions);
    PTA.run();
    LLVMDataDependenceAnalysis DDA(M.get(), &PTA, options.dgOptions.DDAOptions);
    DDA.run();
    LLVMControlDependenceAnalysis CDA(M.get(), options.dgOptions.CDAOptions);
    // CDA runs on-demand

    llvmdg::SystemDependenceGraph sdg(M.get(), &PTA, &DDA, &CDA);

    SDGDumper dumper(options, &sdg, dump_bb_only);
    dumper.dumpToDot();

    return 0;
}